

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericDescriptor::GenericDescriptor(GenericDescriptor *this,GenericDescriptor *rhs)

{
  GenericDescriptor *rhs_local;
  GenericDescriptor *this_local;
  
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericDescriptor_0033a548;
  Array<Kumu::UUID>::Array(&this->Locators);
  Array<Kumu::UUID>::Array(&this->SubDescriptors);
  (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
  return;
}

Assistant:

GenericDescriptor::GenericDescriptor(const GenericDescriptor& rhs) : InterchangeObject(rhs.m_Dict)
{
  Copy(rhs);
}